

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_animatable_default<tinyusdz::value::normal3f>
                   (string *__return_storage_ptr__,Animatable<tinyusdz::value::normal3f> *v,
                   uint32_t indent)

{
  normal3f a;
  stringstream ss;
  normal3f local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  if (v->_blocked == true) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"None",4);
  }
  if (v->_has_value == true) {
    if (v->_blocked != false) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]","");
      goto LAB_0030b205;
    }
    local_1b0.z = (v->_value).z;
    local_1b0.x = (v->_value).x;
    local_1b0.y = (v->_value).y;
    ::std::operator<<(local_190,&local_1b0);
  }
  ::std::__cxx11::stringbuf::str();
LAB_0030b205:
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}